

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

bool __thiscall slang::parsing::Parser::isConditionalExpression(Parser *this)

{
  uint32_t offset;
  bool bVar1;
  TokenKind TVar2;
  TokenKind start;
  Token TVar3;
  uint32_t local_1c;
  
  local_1c = 1;
LAB_003349c1:
  offset = local_1c;
  local_1c = local_1c + 1;
  TVar3 = ParserBase::peek(&this->super_ParserBase,offset);
  TVar2 = TVar3.kind;
  switch(TVar2) {
  case OpenBrace:
    start = OpenBrace;
    TVar2 = CloseBrace;
    break;
  case CloseBrace:
  case CloseBracket:
  case OpenParenthesisStar:
    goto switchD_003349e2_caseD_e;
  case OpenBracket:
    start = OpenBracket;
    TVar2 = CloseBracket;
    break;
  case OpenParenthesis:
    start = OpenParenthesis;
    TVar2 = CloseParenthesis;
    break;
  case CloseParenthesis:
    goto LAB_00334a3c;
  default:
    if (TVar2 == Question) {
      return true;
    }
switchD_003349e2_caseD_e:
    bVar1 = slang::syntax::SyntaxFacts::isNotInType(TVar2);
    if (bVar1) {
LAB_00334a3c:
      return false;
    }
    goto LAB_003349c1;
  }
  bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>(this,&local_1c,start,TVar2);
  if (!bVar1) {
    return false;
  }
  goto LAB_003349c1;
}

Assistant:

bool Parser::isConditionalExpression() {
    uint32_t index = 1;
    while (true) {
        TokenKind kind = peek(index++).kind;
        switch (kind) {
            case TokenKind::Question:
                return true;
            case TokenKind::CloseParenthesis:
                return false;
            case TokenKind::OpenParenthesis:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                               TokenKind::CloseParenthesis)) {
                    return false;
                }
                break;
            case TokenKind::OpenBrace:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBrace,
                                               TokenKind::CloseBrace)) {
                    return false;
                }
                break;
            case TokenKind::OpenBracket:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBracket,
                                               TokenKind::CloseBracket)) {
                    return false;
                }
                break;
            default:
                if (isNotInType(kind))
                    return false;
                break;
        }
    }
}